

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<std::function<bool_(void_*)>,_std::allocator>::destroy
          (stack_type<std::function<bool_(void_*)>,_std::allocator> *this)

{
  function<bool_(void_*)> *this_00;
  
  while (this->m_current != this->m_start) {
    this_00 = this->m_current + -1;
    this->m_current = this_00;
    std::_Function_base::~_Function_base(&this_00->super__Function_base);
  }
  operator_delete(this->m_data,this->m_size << 5);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}